

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O1

double __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::ted_k
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,int k)

{
  int iVar1;
  int iVar2;
  double dVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_40;
  
  init(this,(EVP_PKEY_CTX *)t2);
  iVar1 = (t1->super_Constants).tree_size_ - (t2->super_Constants).tree_size_;
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  if (k < iVar2) {
    dVar3 = INFINITY;
  }
  else {
    lb_mapping_fill_gaps(&local_40,this,t1,t2,k);
    dVar3 = mapping_cost(this,t1,t2,&local_40);
    if (local_40.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return dVar3;
}

Assistant:

double LGMTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  // Initialize the internals.
  init(t2);

  // We don't compute the upper bound for node pairs with size lower bound
  // greater than threshold.
  if (std::abs(t1.tree_size_ - t2.tree_size_) > k) {
    return std::numeric_limits<double>::infinity();
  }
  return mapping_cost(t1, t2, lb_mapping_fill_gaps(t1, t2, k));
}